

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-quantize-fns.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  pointer pfVar2;
  pointer pfVar3;
  bool bVar4;
  size_t i;
  long *plVar5;
  undefined8 uVar6;
  undefined8 *puVar7;
  size_t n;
  size_t n_00;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  double sum;
  float fVar16;
  allocator_type local_d9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tmp_q;
  vector<float,_std::allocator<float>_> tmp_out;
  vector<float,_std::allocator<float>_> tmp_out_ref;
  vector<float,_std::allocator<float>_> test_data;
  vector<float,_std::allocator<float>_> test_data2;
  string arg;
  
  arg._M_dataplus._M_p = (pointer)&arg.field_2;
  arg._M_string_length = 0;
  arg.field_2._M_local_buf[0] = '\0';
  lVar11 = 1;
  bVar1 = false;
  do {
    if (argc <= lVar11) {
      std::vector<float,_std::allocator<float>_>::vector(&test_data,0x1000,(allocator_type *)&tmp_q)
      ;
      std::vector<float,_std::allocator<float>_>::vector
                (&test_data2,0x1000,(allocator_type *)&tmp_q);
      generate_data(0.0,(long)test_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)test_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2,
                    test_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
      generate_data(1.0,(long)test_data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)test_data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                              super__Vector_impl_data._M_start >> 2,
                    test_data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
      ggml_cpu_init();
      uVar9 = 0;
      for (uVar10 = 0; uVar10 != 0x27; uVar10 = uVar10 + 1) {
        lVar11 = ggml_get_type_traits(uVar10);
        plVar5 = (long *)ggml_get_type_traits_cpu(uVar10);
        if (*(long *)(lVar11 + 8) != 0) {
          uVar6 = ggml_type_name(uVar10);
          printf("Testing %s\n",uVar6);
          ggml_quantize_init(uVar10);
          pfVar2 = test_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if ((*plVar5 != 0) && (*(long *)(lVar11 + 0x28) != 0)) {
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&tmp_q,0x2000,(allocator_type *)&tmp_out);
            std::vector<float,_std::allocator<float>_>::vector
                      (&tmp_out,0x1000,(allocator_type *)&tmp_out_ref);
            (*(code *)*plVar5)(pfVar2,tmp_q.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,0x1000);
            (**(code **)(lVar11 + 0x28))
                      (tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       tmp_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,0x1000);
            fVar12 = array_rmse(pfVar2,tmp_out.super__Vector_base<float,_std::allocator<float>_>.
                                       _M_impl.super__Vector_impl_data._M_start,n);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&tmp_out.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            uVar8 = uVar10 & 0x3e;
            fVar13 = 0.01;
            if ((uVar8 != 0x22) && (fVar13 = 0.0075, uVar10 != 10)) {
              if ((uVar10 == 0xb) || (uVar10 == 0x15)) {
                fVar13 = 0.004;
              }
              else {
                fVar13 = 0.0075;
                if (uVar10 != 0x16) {
                  fVar13 = *(float *)(&DAT_00103020 + (ulong)(uVar10 == 0x12) * 4);
                }
              }
            }
            if (bVar1 || fVar13 <= fVar12) {
              uVar6 = ggml_type_name(uVar10);
              printf("%5s absolute quantization error:    %s (%f)\n",(double)fVar12,uVar6,
                     RESULT_STR[fVar13 <= fVar12]);
            }
            pfVar2 = test_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&tmp_q,0x2000,(allocator_type *)&tmp_out);
            std::vector<float,_std::allocator<float>_>::vector
                      (&tmp_out,0x1000,(allocator_type *)&tmp_out_ref);
            std::vector<float,_std::allocator<float>_>::vector(&tmp_out_ref,0x1000,&local_d9);
            (*(code *)*plVar5)(pfVar2,tmp_q.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,0x1000);
            (**(code **)(lVar11 + 0x28))
                      (tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       tmp_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,0x1000);
            (**(code **)(lVar11 + 0x30))
                      (pfVar2,tmp_q.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,0x1000);
            (**(code **)(lVar11 + 0x28))
                      (tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,
                       CONCAT44(tmp_out_ref.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                tmp_out_ref.super__Vector_base<float,_std::allocator<float>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_),0x1000);
            fVar14 = array_rmse(tmp_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (float *)CONCAT44(tmp_out_ref.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                                  tmp_out_ref.
                                                  super__Vector_base<float,_std::allocator<float>_>.
                                                  _M_impl.super__Vector_impl_data._M_start._0_4_),
                                n_00);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&tmp_out_ref.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                      (&tmp_out.super__Vector_base<float,_std::allocator<float>_>);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            if (bVar1 || 0.0001 <= fVar14) {
              uVar6 = ggml_type_name(uVar10);
              printf("%5s reference implementation error: %s (%f)\n",(double)fVar14,uVar6,
                     RESULT_STR[0.0001 <= fVar14]);
            }
            pfVar3 = test_data2.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pfVar2 = test_data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      (&tmp_q,0x2000,(allocator_type *)&tmp_out);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_out,0x2000,
                       (allocator_type *)&tmp_out_ref);
            puVar7 = (undefined8 *)ggml_get_type_traits_cpu((int)plVar5[2]);
            (*(code *)*plVar5)(pfVar2,tmp_q.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start,0x1000);
            (*(code *)*puVar7)(pfVar3,tmp_out.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,0x1000);
            tmp_out_ref.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start._0_4_ = INFINITY;
            (*(code *)plVar5[1])
                      (0x1000,&tmp_out_ref,0,
                       tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start,0,
                       tmp_out.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,0,1);
            fVar15 = 0.0;
            for (lVar11 = 0; lVar11 != 0x1000; lVar11 = lVar11 + 1) {
              fVar15 = fVar15 + pfVar2[lVar11] * pfVar3[lVar11];
            }
            fVar16 = ABS(tmp_out_ref.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start._0_4_ - fVar15) * 0.00024414062;
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tmp_out);
            std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      (&tmp_q.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
            fVar15 = 0.04;
            if ((uVar8 != 0x10) &&
               ((0x16 < uVar10 || (fVar15 = 0.04, (0x640400U >> (uVar10 & 0x1f) & 1) == 0)))) {
              fVar15 = *(float *)(&DAT_00103028 + (ulong)(uVar8 == 0x22) * 4);
            }
            uVar9 = (uint)(0.0001 <= fVar14) + uVar9 + (fVar13 <= fVar12) + (uint)(fVar15 <= fVar16)
            ;
            if (fVar15 <= fVar16 || bVar1) {
              uVar6 = ggml_type_name(uVar10);
              printf("%5s dot product error:              %s (%f)\n",(double)fVar16,uVar6,
                     RESULT_STR[fVar15 <= fVar16]);
            }
          }
        }
      }
      if (bVar1 || uVar9 != 0) {
        printf("%d tests failed\n",(ulong)uVar9);
      }
      uVar9 = (uint)(0 < (int)uVar9);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&test_data2.super__Vector_base<float,_std::allocator<float>_>);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&test_data.super__Vector_base<float,_std::allocator<float>_>);
      goto LAB_0010284c;
    }
    std::__cxx11::string::assign((char *)&arg);
    bVar4 = std::operator==(&arg,"-v");
    lVar11 = lVar11 + 1;
    bVar1 = true;
  } while (bVar4);
  fprintf(_stderr,"error: unknown argument: %s\n",arg._M_dataplus._M_p);
  uVar9 = 1;
LAB_0010284c:
  std::__cxx11::string::~string((string *)&arg);
  return uVar9;
}

Assistant:

int main(int argc, char * argv[]) {
    bool verbose = false;
    const size_t test_size = 32 * 128;

    std::string arg;
    for (int i = 1; i < argc; i++) {
        arg = argv[i];

        if (arg == "-v") {
            verbose = true;
        } else {
            fprintf(stderr, "error: unknown argument: %s\n", arg.c_str());
            return 1;
        }
    }

    std::vector<float> test_data(test_size);
    std::vector<float> test_data2(test_size);

    generate_data(0.0, test_data.size(), test_data.data());
    generate_data(1.0, test_data2.size(), test_data2.data());

    ggml_cpu_init();

    int num_failed = 0;
    bool failed = false;

    for (int i = 0; i < GGML_TYPE_COUNT; i++) {
        ggml_type type = (ggml_type) i;
        const auto * qfns = ggml_get_type_traits(type);
        const auto * qfns_cpu = ggml_get_type_traits_cpu(type);

        // deprecated - skip
        if (qfns->blck_size == 0) {
            continue;
        }

        const ggml_type ei = (ggml_type)i;

        printf("Testing %s\n", ggml_type_name((ggml_type) i));
        ggml_quantize_init(ei);

        if (qfns_cpu->from_float && qfns->to_float) {
            const float total_error = total_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            const float max_quantization_error =
                type == GGML_TYPE_TQ1_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_TQ2_0   ? MAX_QUANTIZATION_TOTAL_ERROR_TERNARY :
                type == GGML_TYPE_Q2_K    ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_IQ2_S   ? MAX_QUANTIZATION_TOTAL_ERROR_2BITS :
                type == GGML_TYPE_Q3_K    ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_S   ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS :
                type == GGML_TYPE_IQ3_XXS ? MAX_QUANTIZATION_TOTAL_ERROR_3BITS_XXS : MAX_QUANTIZATION_TOTAL_ERROR;
            failed = !(total_error < max_quantization_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s absolute quantization error:    %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], total_error);
            }

            const float reference_error = reference_quantization_error(qfns, qfns_cpu, test_size, test_data.data());
            failed = !(reference_error < MAX_QUANTIZATION_REFERENCE_ERROR);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s reference implementation error: %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], reference_error);
            }

            const float vec_dot_error = dot_product_error(qfns, qfns_cpu, test_size, test_data.data(), test_data2.data());
            const float max_allowed_error = type == GGML_TYPE_Q2_K || type == GGML_TYPE_IQ2_XS || type == GGML_TYPE_IQ2_XXS ||
                                            type == GGML_TYPE_IQ3_XXS || type == GGML_TYPE_IQ3_S || type == GGML_TYPE_IQ2_S
                                          ? MAX_DOT_PRODUCT_ERROR_LOWBIT
                                          : type == GGML_TYPE_TQ1_0 || type == GGML_TYPE_TQ2_0
                                          ? MAX_DOT_PRODUCT_ERROR_TERNARY
                                          : MAX_DOT_PRODUCT_ERROR;
            failed = !(vec_dot_error < max_allowed_error);
            num_failed += failed;
            if (failed || verbose) {
                printf("%5s dot product error:              %s (%f)\n", ggml_type_name(type), RESULT_STR[failed], vec_dot_error);
            }
        }
    }

    if (num_failed || verbose) {
        printf("%d tests failed\n", num_failed);
    }

    return num_failed > 0;
}